

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O0

void ImTui::ShowStyleEditor(ImGuiStyle *ref)

{
  ImVec4 IVar1;
  ImFontAtlas *pIVar2;
  ImGuiTextFilter *this;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImVec2 IVar7;
  undefined1 auVar8 [11];
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  bool bVar16;
  int iVar17;
  ImVec2 *__s;
  size_t sVar18;
  ImVec4 *pIVar19;
  ImGuiIO *pIVar20;
  ImFont **ppIVar21;
  ImFontGlyph *pIVar22;
  ImVec4 *pIVar23;
  ImGuiStyle *in_RDI;
  char *pcVar24;
  undefined1 extraout_XMM0_Ba;
  char cVar25;
  undefined1 extraout_XMM0_Ba_00;
  undefined1 extraout_XMM0_Ba_01;
  undefined1 extraout_XMM0_Ba_02;
  undefined1 extraout_XMM0_Bb;
  char cVar26;
  undefined1 extraout_XMM0_Bb_00;
  undefined1 extraout_XMM0_Bb_01;
  undefined1 extraout_XMM0_Bb_02;
  undefined1 extraout_XMM0_Bc;
  char cVar27;
  undefined1 extraout_XMM0_Bc_00;
  undefined1 extraout_XMM0_Bc_01;
  undefined1 extraout_XMM0_Bc_02;
  undefined1 extraout_XMM0_Bd;
  char cVar28;
  undefined1 extraout_XMM0_Bd_00;
  undefined1 extraout_XMM0_Bd_01;
  undefined1 extraout_XMM0_Bd_02;
  undefined1 extraout_XMM0_Be;
  char cVar29;
  undefined1 extraout_XMM0_Be_00;
  undefined1 extraout_XMM0_Be_01;
  undefined1 extraout_XMM0_Be_02;
  undefined1 extraout_XMM0_Bf;
  char cVar30;
  undefined1 extraout_XMM0_Bf_00;
  undefined1 extraout_XMM0_Bf_01;
  undefined1 extraout_XMM0_Bf_02;
  undefined1 extraout_XMM0_Bg;
  char cVar31;
  undefined1 extraout_XMM0_Bg_00;
  undefined1 extraout_XMM0_Bg_01;
  undefined1 extraout_XMM0_Bg_02;
  undefined1 extraout_XMM0_Bh;
  char cVar32;
  undefined1 extraout_XMM0_Bh_00;
  undefined1 extraout_XMM0_Bh_01;
  undefined1 extraout_XMM0_Bh_02;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  byte bVar40;
  ImGuiColorEditFlags in_stack_0000005c;
  float *in_stack_00000060;
  char *in_stack_00000068;
  ImVec4 border_col;
  ImVec4 tint_col;
  ImFontGlyph *glyph;
  ImVec2 cell_p2;
  ImVec2 cell_p1;
  uint n_1;
  ImDrawList *draw_list;
  ImVec2 base_pos;
  float cell_spacing;
  float cell_size;
  uint n;
  int count;
  uint base;
  ImFontConfig *cfg;
  int config_i;
  float surface_sqrt;
  bool font_details_opened;
  ImFont *font;
  int i_2;
  ImFontAtlas *atlas;
  ImGuiIO *io;
  char *name_1;
  int i_1;
  char *name;
  ImVec4 *col;
  int i;
  int window_menu_button_position;
  bool popup_border;
  bool frame_border;
  bool window_border;
  ImGuiStyle *style;
  ImVec2 *in_stack_fffffffffffffe68;
  ImGuiSliderFlags flags;
  ImGuiTextFilter *in_stack_fffffffffffffe70;
  ImDrawList *in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  ImGuiTextFilter *in_stack_fffffffffffffe88;
  ImGuiTextFilter *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  ImVec2 *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  float in_stack_fffffffffffffeb4;
  ImU32 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImVec2 in_stack_fffffffffffffec0;
  ImVec2 in_stack_fffffffffffffec8;
  ImVec2 in_stack_fffffffffffffed0;
  ImGuiStyle *in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  ImVec2 *in_stack_ffffffffffffff00;
  ImDrawList *in_stack_ffffffffffffff10;
  ImVec2 local_e4;
  uint local_dc;
  ImDrawList *local_d8;
  float fVar41;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float fVar42;
  uint in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  ImFontConfig *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  int local_8c;
  ImVec2 local_78;
  ImVec2 local_70;
  char *local_68;
  int local_5c;
  ImVec2 local_58;
  ImVec2 *in_stack_ffffffffffffffb0;
  ImVec4 *in_stack_ffffffffffffffb8;
  int local_40;
  ImVec2 local_3c;
  int local_34;
  ImVec2 local_30;
  ImVec2 local_28;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  ImGuiStyle *local_10;
  ImGuiStyle *local_8;
  
  local_8 = in_RDI;
  local_10 = ImGui::GetStyle();
  if ((ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') &&
     (iVar17 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style), iVar17 != 0)) {
    ImGuiStyle::ImGuiStyle(in_stack_fffffffffffffee0);
    __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
  }
  if (((ShowStyleEditor::init & 1U) != 0) && (local_8 == (ImGuiStyle *)0x0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_10,0x414);
  }
  ShowStyleEditor::init = false;
  if (local_8 == (ImGuiStyle *)0x0) {
    local_8 = &ShowStyleEditor::ref_saved_style;
  }
  ImGui::GetWindowWidth();
  ImGui::PushItemWidth(in_stack_fffffffffffffe84);
  bVar16 = ImGui::ShowStyleSelector((char *)in_stack_fffffffffffffe68);
  if (bVar16) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_10,0x414);
  }
  ImGui::ShowFontSelector((char *)in_stack_fffffffffffffea0);
  bVar16 = ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88
                              ,in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                              (char *)in_stack_fffffffffffffe78,
                              (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  if (bVar16) {
    local_10->GrabRounding = local_10->FrameRounding;
  }
  local_1d = 0.0 < local_10->WindowBorderSize;
  bVar16 = ImGui::Checkbox((char *)in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
  if (bVar16) {
    in_stack_fffffffffffffeb8 = 0;
    in_stack_fffffffffffffebc = 1.0;
    if ((local_1d & 1) == 0) {
      in_stack_fffffffffffffebc = 0.0;
    }
    local_10->WindowBorderSize = in_stack_fffffffffffffebc;
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                  SUB84(in_stack_fffffffffffffe70,0));
  local_1e = 0.0 < local_10->FrameBorderSize;
  bVar16 = ImGui::Checkbox((char *)in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
  if (bVar16) {
    in_stack_fffffffffffffeb4 = 1.0;
    if ((local_1e & 1) == 0) {
      in_stack_fffffffffffffeb4 = 0.0;
    }
    local_10->FrameBorderSize = in_stack_fffffffffffffeb4;
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                  SUB84(in_stack_fffffffffffffe70,0));
  local_1f = 0.0 < local_10->PopupBorderSize;
  bVar16 = ImGui::Checkbox((char *)in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
  if (bVar16) {
    in_stack_fffffffffffffea8 = 0;
    in_stack_fffffffffffffeac = 1.0;
    if ((local_1f & 1) == 0) {
      in_stack_fffffffffffffeac = 0.0;
    }
    local_10->PopupBorderSize = in_stack_fffffffffffffeac;
  }
  ImVec2::ImVec2(&local_28,0.0,0.0);
  bVar16 = ImGui::Button(in_stack_fffffffffffffe70->InputBuf,in_stack_fffffffffffffe68);
  if (bVar16) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_10,0x414);
    memcpy(local_8,&ShowStyleEditor::ref_saved_style,0x414);
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                  SUB84(in_stack_fffffffffffffe70,0));
  ImVec2::ImVec2(&local_30,0.0,0.0);
  bVar16 = ImGui::Button(in_stack_fffffffffffffe70->InputBuf,in_stack_fffffffffffffe68);
  if (bVar16) {
    memcpy(local_10,local_8,0x414);
  }
  ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                  SUB84(in_stack_fffffffffffffe70,0));
  HelpMarker((char *)0x10d47e);
  ImGui::Separator();
  bVar16 = ImGui::BeginTabBar((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              (ImGuiTabBarFlags)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  if (bVar16) {
    bVar16 = ImGui::BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98),
                                 (bool *)in_stack_fffffffffffffe90,
                                 (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    if (bVar16) {
      ImGui::Text("Main");
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::Text("Borders");
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::Text("Rounding");
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SliderFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                         (char *)in_stack_fffffffffffffe78,
                         (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::Text("Alignment");
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      local_34 = local_10->WindowMenuButtonPosition + 1;
      bVar16 = ImGui::Combo(in_stack_fffffffffffffe90->InputBuf,(int *)in_stack_fffffffffffffe88,
                            (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      if (bVar16) {
        local_10->WindowMenuButtonPosition = local_34 + -1;
      }
      ImGui::Combo(in_stack_fffffffffffffe90->InputBuf,(int *)in_stack_fffffffffffffe88,
                   (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      HelpMarker((char *)0x10d95b);
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      HelpMarker((char *)0x10d9a6);
      ImGui::Text("Safe Area Padding");
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      HelpMarker((char *)0x10d9d0);
      ImGui::SliderFloat2(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                          (char *)in_stack_fffffffffffffe78,
                          (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      ImGui::EndTabItem();
    }
    bVar16 = ImGui::BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98),
                                 (bool *)in_stack_fffffffffffffe90,
                                 (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    if (bVar16) {
      ImVec2::ImVec2(&local_3c,0.0,0.0);
      bVar16 = ImGui::Button(in_stack_fffffffffffffe70->InputBuf,in_stack_fffffffffffffe68);
      if (bVar16) {
        iVar17 = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
        if (ShowStyleEditor::output_dest == 0) {
          ImGui::LogToClipboard(iVar17);
        }
        else {
          ImGui::LogToTTY(iVar17);
        }
        ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        for (local_40 = 0; local_40 < 0x35; local_40 = local_40 + 1) {
          in_stack_ffffffffffffffb8 = local_10->Colors + local_40;
          __s = (ImVec2 *)ImGui::GetStyleColorName(local_40);
          in_stack_ffffffffffffffb0 = __s;
          if ((ShowStyleEditor::output_only_modified & 1U) == 0) {
LAB_0010db1b:
            sVar18 = strlen((char *)__s);
            ImGui::LogText((char *)CONCAT17(extraout_XMM0_Bh,
                                            CONCAT16(extraout_XMM0_Bg,
                                                     CONCAT15(extraout_XMM0_Bf,
                                                              CONCAT14(extraout_XMM0_Be,
                                                                       CONCAT13(extraout_XMM0_Bd,
                                                                                CONCAT12(
                                                  extraout_XMM0_Bc,
                                                  CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))))))),
                           (double)in_stack_ffffffffffffffb8->y,(double)in_stack_ffffffffffffffb8->z
                           ,(double)in_stack_ffffffffffffffb8->w,
                           "colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",__s,
                           (ulong)(0x17 - (int)sVar18),"");
            in_stack_fffffffffffffea0 = __s;
          }
          else {
            IVar1 = local_8->Colors[local_40];
            cVar25 = -(*(char *)&in_stack_ffffffffffffffb8->x == IVar1.x._0_1_);
            cVar26 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->x + 1) == IVar1.x._1_1_);
            cVar27 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->x + 2) == IVar1.x._2_1_);
            cVar28 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->x + 3) == IVar1.x._3_1_);
            cVar29 = -(*(char *)&in_stack_ffffffffffffffb8->y == IVar1.y._0_1_);
            cVar30 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->y + 1) == IVar1.y._1_1_);
            cVar31 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->y + 2) == IVar1.y._2_1_);
            cVar32 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->y + 3) == IVar1.y._3_1_);
            cVar33 = -(*(char *)&in_stack_ffffffffffffffb8->z == IVar1.z._0_1_);
            cVar34 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->z + 1) == IVar1.z._1_1_);
            cVar35 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->z + 2) == IVar1.z._2_1_);
            cVar36 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->z + 3) == IVar1.z._3_1_);
            cVar37 = -(*(char *)&in_stack_ffffffffffffffb8->w == IVar1.w._0_1_);
            cVar38 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->w + 1) == IVar1.w._1_1_);
            cVar39 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->w + 2) == IVar1.w._2_1_);
            bVar40 = -(*(undefined1 *)((long)&in_stack_ffffffffffffffb8->w + 3) == IVar1.w._3_1_);
            auVar5[1] = cVar26;
            auVar5[0] = cVar25;
            auVar5[2] = cVar27;
            auVar5[3] = cVar28;
            auVar5[4] = cVar29;
            auVar5[5] = cVar30;
            auVar5[6] = cVar31;
            auVar5[7] = cVar32;
            auVar5[8] = cVar33;
            auVar5[9] = cVar34;
            auVar5[10] = cVar35;
            auVar5[0xb] = cVar36;
            auVar5[0xc] = cVar37;
            auVar5[0xd] = cVar38;
            auVar5[0xe] = cVar39;
            auVar5[0xf] = bVar40;
            auVar6[1] = cVar26;
            auVar6[0] = cVar25;
            auVar6[2] = cVar27;
            auVar6[3] = cVar28;
            auVar6[4] = cVar29;
            auVar6[5] = cVar30;
            auVar6[6] = cVar31;
            auVar6[7] = cVar32;
            auVar6[8] = cVar33;
            auVar6[9] = cVar34;
            auVar6[10] = cVar35;
            auVar6[0xb] = cVar36;
            auVar6[0xc] = cVar37;
            auVar6[0xd] = cVar38;
            auVar6[0xe] = cVar39;
            auVar6[0xf] = bVar40;
            auVar14[1] = cVar28;
            auVar14[0] = cVar27;
            auVar14[2] = cVar29;
            auVar14[3] = cVar30;
            auVar14[4] = cVar31;
            auVar14[5] = cVar32;
            auVar14[6] = cVar33;
            auVar14[7] = cVar34;
            auVar14[8] = cVar35;
            auVar14[9] = cVar36;
            auVar14[10] = cVar37;
            auVar14[0xb] = cVar38;
            auVar14[0xc] = cVar39;
            auVar14[0xd] = bVar40;
            auVar12[1] = cVar29;
            auVar12[0] = cVar28;
            auVar12[2] = cVar30;
            auVar12[3] = cVar31;
            auVar12[4] = cVar32;
            auVar12[5] = cVar33;
            auVar12[6] = cVar34;
            auVar12[7] = cVar35;
            auVar12[8] = cVar36;
            auVar12[9] = cVar37;
            auVar12[10] = cVar38;
            auVar12[0xb] = cVar39;
            auVar12[0xc] = bVar40;
            auVar10[1] = cVar30;
            auVar10[0] = cVar29;
            auVar10[2] = cVar31;
            auVar10[3] = cVar32;
            auVar10[4] = cVar33;
            auVar10[5] = cVar34;
            auVar10[6] = cVar35;
            auVar10[7] = cVar36;
            auVar10[8] = cVar37;
            auVar10[9] = cVar38;
            auVar10[10] = cVar39;
            auVar10[0xb] = bVar40;
            auVar8[1] = cVar31;
            auVar8[0] = cVar30;
            auVar8[2] = cVar32;
            auVar8[3] = cVar33;
            auVar8[4] = cVar34;
            auVar8[5] = cVar35;
            auVar8[6] = cVar36;
            auVar8[7] = cVar37;
            auVar8[8] = cVar38;
            auVar8[9] = cVar39;
            auVar8[10] = bVar40;
            if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar40,CONCAT18(cVar39,CONCAT17(cVar38,CONCAT16(
                                                  cVar37,CONCAT15(cVar36,CONCAT14(cVar35,CONCAT13(
                                                  cVar34,CONCAT12(cVar33,CONCAT11(cVar32,cVar31)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar40,CONCAT17(cVar39,CONCAT16(cVar38,CONCAT15(
                                                  cVar37,CONCAT14(cVar36,CONCAT13(cVar35,CONCAT12(
                                                  cVar34,CONCAT11(cVar33,cVar32)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar40 >> 7) << 0xf) != 0xffff) goto LAB_0010db1b;
          }
        }
        ImGui::LogFinish();
      }
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      ImGui::SetNextItemWidth(120.0);
      ImGui::Combo(in_stack_fffffffffffffe90->InputBuf,(int *)in_stack_fffffffffffffe88,
                   (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      ImGui::Checkbox((char *)in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
      if ((ShowStyleEditor(ImGuiStyle*)::filter == '\0') &&
         (iVar17 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter), iVar17 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88->InputBuf);
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
      ImGui::GetFontSize();
      ImGuiTextFilter::Draw
                ((ImGuiTextFilter *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (char *)in_stack_fffffffffffffe78,(float)((ulong)in_stack_fffffffffffffe70 >> 0x20)
                );
      ImGui::RadioButton(in_stack_fffffffffffffe70->InputBuf,(int *)in_stack_fffffffffffffe68,0);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      ImGui::RadioButton(in_stack_fffffffffffffe70->InputBuf,(int *)in_stack_fffffffffffffe68,0);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      ImGui::RadioButton(in_stack_fffffffffffffe70->InputBuf,(int *)in_stack_fffffffffffffe68,0);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      HelpMarker((char *)0x10dd0f);
      ImVec2::ImVec2(&local_58,0.0,0.0);
      ImGui::BeginChild((char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        (ImVec2 *)in_stack_fffffffffffffe78,
                        SUB81((ulong)in_stack_fffffffffffffe70 >> 0x38,0),
                        (ImGuiWindowFlags)in_stack_fffffffffffffe70);
      ImGui::GetWindowWidth();
      ImGui::PushItemWidth(in_stack_fffffffffffffe84);
      for (local_5c = 0; local_5c < 0x35; local_5c = local_5c + 1) {
        local_68 = ImGui::GetStyleColorName(local_5c);
        bVar16 = ImGuiTextFilter::PassFilter
                           (in_stack_fffffffffffffe88,
                            (char *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (char *)in_stack_fffffffffffffe78);
        if (bVar16) {
          ImGui::PushID((int)in_stack_fffffffffffffe84);
          ImGui::ColorEdit4(in_stack_00000068,in_stack_00000060,in_stack_0000005c);
          pIVar19 = local_10->Colors + local_5c;
          IVar1 = local_8->Colors[local_5c];
          cVar25 = -(*(char *)&pIVar19->x == IVar1.x._0_1_);
          cVar26 = -(*(undefined1 *)((long)&pIVar19->x + 1) == IVar1.x._1_1_);
          cVar27 = -(*(undefined1 *)((long)&pIVar19->x + 2) == IVar1.x._2_1_);
          cVar28 = -(*(undefined1 *)((long)&pIVar19->x + 3) == IVar1.x._3_1_);
          cVar29 = -(*(char *)&pIVar19->y == IVar1.y._0_1_);
          cVar30 = -(*(undefined1 *)((long)&pIVar19->y + 1) == IVar1.y._1_1_);
          cVar31 = -(*(undefined1 *)((long)&pIVar19->y + 2) == IVar1.y._2_1_);
          cVar32 = -(*(undefined1 *)((long)&pIVar19->y + 3) == IVar1.y._3_1_);
          cVar33 = -(*(char *)&pIVar19->z == IVar1.z._0_1_);
          cVar34 = -(*(undefined1 *)((long)&pIVar19->z + 1) == IVar1.z._1_1_);
          cVar35 = -(*(undefined1 *)((long)&pIVar19->z + 2) == IVar1.z._2_1_);
          cVar36 = -(*(undefined1 *)((long)&pIVar19->z + 3) == IVar1.z._3_1_);
          cVar37 = -(*(char *)&pIVar19->w == IVar1.w._0_1_);
          cVar38 = -(*(undefined1 *)((long)&pIVar19->w + 1) == IVar1.w._1_1_);
          cVar39 = -(*(undefined1 *)((long)&pIVar19->w + 2) == IVar1.w._2_1_);
          bVar40 = -(*(undefined1 *)((long)&pIVar19->w + 3) == IVar1.w._3_1_);
          auVar3[1] = cVar26;
          auVar3[0] = cVar25;
          auVar3[2] = cVar27;
          auVar3[3] = cVar28;
          auVar3[4] = cVar29;
          auVar3[5] = cVar30;
          auVar3[6] = cVar31;
          auVar3[7] = cVar32;
          auVar3[8] = cVar33;
          auVar3[9] = cVar34;
          auVar3[10] = cVar35;
          auVar3[0xb] = cVar36;
          auVar3[0xc] = cVar37;
          auVar3[0xd] = cVar38;
          auVar3[0xe] = cVar39;
          auVar3[0xf] = bVar40;
          auVar4[1] = cVar26;
          auVar4[0] = cVar25;
          auVar4[2] = cVar27;
          auVar4[3] = cVar28;
          auVar4[4] = cVar29;
          auVar4[5] = cVar30;
          auVar4[6] = cVar31;
          auVar4[7] = cVar32;
          auVar4[8] = cVar33;
          auVar4[9] = cVar34;
          auVar4[10] = cVar35;
          auVar4[0xb] = cVar36;
          auVar4[0xc] = cVar37;
          auVar4[0xd] = cVar38;
          auVar4[0xe] = cVar39;
          auVar4[0xf] = bVar40;
          auVar15[1] = cVar28;
          auVar15[0] = cVar27;
          auVar15[2] = cVar29;
          auVar15[3] = cVar30;
          auVar15[4] = cVar31;
          auVar15[5] = cVar32;
          auVar15[6] = cVar33;
          auVar15[7] = cVar34;
          auVar15[8] = cVar35;
          auVar15[9] = cVar36;
          auVar15[10] = cVar37;
          auVar15[0xb] = cVar38;
          auVar15[0xc] = cVar39;
          auVar15[0xd] = bVar40;
          auVar13[1] = cVar29;
          auVar13[0] = cVar28;
          auVar13[2] = cVar30;
          auVar13[3] = cVar31;
          auVar13[4] = cVar32;
          auVar13[5] = cVar33;
          auVar13[6] = cVar34;
          auVar13[7] = cVar35;
          auVar13[8] = cVar36;
          auVar13[9] = cVar37;
          auVar13[10] = cVar38;
          auVar13[0xb] = cVar39;
          auVar13[0xc] = bVar40;
          auVar11[1] = cVar30;
          auVar11[0] = cVar29;
          auVar11[2] = cVar31;
          auVar11[3] = cVar32;
          auVar11[4] = cVar33;
          auVar11[5] = cVar34;
          auVar11[6] = cVar35;
          auVar11[7] = cVar36;
          auVar11[8] = cVar37;
          auVar11[9] = cVar38;
          auVar11[10] = cVar39;
          auVar11[0xb] = bVar40;
          auVar9[1] = cVar31;
          auVar9[0] = cVar30;
          auVar9[2] = cVar32;
          auVar9[3] = cVar33;
          auVar9[4] = cVar34;
          auVar9[5] = cVar35;
          auVar9[6] = cVar36;
          auVar9[7] = cVar37;
          auVar9[8] = cVar38;
          auVar9[9] = cVar39;
          auVar9[10] = bVar40;
          if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar15 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar40,CONCAT18(cVar39,CONCAT17(cVar38,CONCAT16(
                                                  cVar37,CONCAT15(cVar36,CONCAT14(cVar35,CONCAT13(
                                                  cVar34,CONCAT12(cVar33,CONCAT11(cVar32,cVar31)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar40,CONCAT17(cVar39,CONCAT16(cVar38,CONCAT15(
                                                  cVar37,CONCAT14(cVar36,CONCAT13(cVar35,CONCAT12(
                                                  cVar34,CONCAT11(cVar33,cVar32)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar40 >> 7) << 0xf) != 0xffff) {
            ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            SUB84(in_stack_fffffffffffffe70,0));
            ImVec2::ImVec2(&local_70,0.0,0.0);
            bVar16 = ImGui::Button(in_stack_fffffffffffffe70->InputBuf,in_stack_fffffffffffffe68);
            if (bVar16) {
              pIVar23 = local_10->Colors + local_5c;
              pIVar19 = local_8->Colors + local_5c;
              fVar41 = pIVar23->y;
              pIVar19->x = pIVar23->x;
              pIVar19->y = fVar41;
              fVar41 = pIVar23->w;
              pIVar19->z = pIVar23->z;
              pIVar19->w = fVar41;
            }
            ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            SUB84(in_stack_fffffffffffffe70,0));
            ImVec2::ImVec2(&local_78,0.0,0.0);
            bVar16 = ImGui::Button(in_stack_fffffffffffffe70->InputBuf,in_stack_fffffffffffffe68);
            if (bVar16) {
              pIVar23 = local_8->Colors + local_5c;
              pIVar19 = local_10->Colors + local_5c;
              fVar41 = pIVar23->y;
              pIVar19->x = pIVar23->x;
              pIVar19->y = fVar41;
              fVar41 = pIVar23->w;
              pIVar19->z = pIVar23->z;
              pIVar19->w = fVar41;
            }
          }
          ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                          SUB84(in_stack_fffffffffffffe70,0));
          ImGui::TextUnformatted
                    (in_stack_fffffffffffffe70->InputBuf,(char *)in_stack_fffffffffffffe68);
          ImGui::PopID();
        }
      }
      ImGui::PopItemWidth();
      ImGui::EndChild();
      ImGui::EndTabItem();
    }
    bVar16 = ImGui::BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98),
                                 (bool *)in_stack_fffffffffffffe90,
                                 (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    fVar41 = (float)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    flags = (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    if (bVar16) {
      pIVar20 = ImGui::GetIO();
      pIVar2 = pIVar20->Fonts;
      HelpMarker((char *)0x10e01b);
      ImGui::PushItemWidth(in_stack_fffffffffffffe84);
      local_8c = 0;
      while( true ) {
        fVar41 = (float)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        flags = (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe68 >> 0x20);
        if ((pIVar2->Fonts).Size <= local_8c) break;
        ppIVar21 = ImVector<ImFont_*>::operator[](&pIVar2->Fonts,local_8c);
        this = (ImGuiTextFilter *)*ppIVar21;
        ImGui::PushID((void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        if (*(ImFontConfig **)((long)((ImVector<float> *)this->InputBuf + 4) + 8) ==
            (ImFontConfig *)0x0) {
          in_stack_fffffffffffffe88 = (ImGuiTextFilter *)0x1dafde;
        }
        else {
          in_stack_fffffffffffffe88 =
               (ImGuiTextFilter *)
               (*(ImFontConfig **)((long)((ImVector<float> *)this->InputBuf + 4) + 8))->Name;
        }
        in_stack_fffffffffffffe90 = this;
        in_stack_fffffffffffffe9c = local_8c;
        bVar16 = ImGui::TreeNode(this,"Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)",local_8c,
                                 in_stack_fffffffffffffe88,
                                 *(undefined4 *)((long)((ImVector<float> *)this->InputBuf + 2) + 8),
                                 (int)*(short *)((ImVector<float> *)this->InputBuf + 5));
        in_stack_ffffffffffffff64 = CONCAT13(bVar16,(int3)in_stack_ffffffffffffff64);
        ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                        SUB84(in_stack_fffffffffffffe70,0));
        bVar16 = ImGui::SmallButton((char *)CONCAT44(in_stack_fffffffffffffe84,
                                                     in_stack_fffffffffffffe80));
        if (bVar16) {
          pIVar20->FontDefault = (ImFont *)this;
        }
        if ((in_stack_ffffffffffffff64 & 0x1000000) != 0) {
          ImGui::PushFont((ImFont *)in_stack_fffffffffffffe70);
          ImGui::Text("The quick brown fox jumps over the lazy dog");
          ImGui::PopFont();
          ImGui::DragFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                           in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                           (float)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                           in_stack_fffffffffffffe70->InputBuf,
                           (ImGuiSliderFlags)((ulong)in_stack_fffffffffffffe68 >> 0x20));
          ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                          SUB84(in_stack_fffffffffffffe70,0));
          HelpMarker((char *)0x10e1d2);
          ImGui::Text((char *)CONCAT17(extraout_XMM0_Bh_00,
                                       CONCAT16(extraout_XMM0_Bg_00,
                                                CONCAT15(extraout_XMM0_Bf_00,
                                                         CONCAT14(extraout_XMM0_Be_00,
                                                                  CONCAT13(extraout_XMM0_Bd_00,
                                                                           CONCAT12(
                                                  extraout_XMM0_Bc_00,
                                                  CONCAT11(extraout_XMM0_Bb_00,extraout_XMM0_Ba_00))
                                                  ))))),
                      (double)*(float *)((ImVector<float> *)this->InputBuf + 6),
                      (double)(*(float *)((long)((ImVector<float> *)this->InputBuf + 5) + 0xc) -
                              *(float *)((ImVector<float> *)this->InputBuf + 6)),
                      "Ascent: %f, Descent: %f, Height: %f");
          ImGui::Text("Fallback character: \'%c\' (U+%04X)",
                      (ulong)*(ImWchar *)((long)((ImVector<float> *)this->InputBuf + 5) + 2),
                      (ulong)*(ImWchar *)((long)((ImVector<float> *)this->InputBuf + 5) + 2));
          ImGui::Text("Ellipsis character: \'%c\' (U+%04X)",
                      (ulong)*(ImWchar *)((long)((ImVector<float> *)this->InputBuf + 5) + 4),
                      (ulong)*(ImWchar *)((long)((ImVector<float> *)this->InputBuf + 5) + 4));
          in_stack_ffffffffffffff60 =
               sqrtf((float)*(int *)((long)((ImVector<float> *)this->InputBuf + 6) + 4));
          ImGui::Text("Texture Area: about %d px ~%dx%d px",
                      *(int *)((long)((ImVector<float> *)this->InputBuf + 6) + 4),
                      (int)in_stack_ffffffffffffff60,(int)in_stack_ffffffffffffff60);
          for (in_stack_ffffffffffffff5c = 0;
              in_stack_ffffffffffffff5c < *(short *)((ImVector<float> *)this->InputBuf + 5);
              in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c + 1) {
            in_stack_ffffffffffffff50 =
                 *(ImFontConfig **)((long)((ImVector<float> *)this->InputBuf + 4) + 8) +
                 in_stack_ffffffffffffff5c;
            if (in_stack_ffffffffffffff50 != (ImFontConfig *)0x0) {
              ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",
                                in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50->Name,
                                in_stack_ffffffffffffff50->OversampleH,
                                in_stack_ffffffffffffff50->OversampleV,
                                (ulong)(in_stack_ffffffffffffff50->PixelSnapH & 1));
            }
          }
          bVar16 = ImGui::TreeNode("Glyphs","Glyphs (%d)",
                                   *(undefined4 *)
                                    ((long)((ImVector<float> *)this->InputBuf + 2) + 8));
          if (bVar16) {
            for (in_stack_ffffffffffffff4c = 0; in_stack_ffffffffffffff4c < 0x10000;
                in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c + 0x100) {
              in_stack_ffffffffffffff48 = 0;
              for (in_stack_ffffffffffffff44 = 0; in_stack_ffffffffffffff44 < 0x100;
                  in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1) {
                pIVar22 = ImFont::FindGlyphNoFallback
                                    ((ImFont *)this,
                                     (short)in_stack_ffffffffffffff4c +
                                     (short)in_stack_ffffffffffffff44);
                in_stack_ffffffffffffff48 =
                     (uint)(pIVar22 != (ImFontGlyph *)0x0) + in_stack_ffffffffffffff48;
              }
              if (0 < in_stack_ffffffffffffff48) {
                pcVar24 = "glyph";
                if (1 < in_stack_ffffffffffffff48) {
                  pcVar24 = "glyphs";
                }
                bVar16 = ImGui::TreeNode(in_stack_ffffffffffffff4c,"U+%04X..U+%04X (%d %s)",
                                         in_stack_ffffffffffffff4c,
                                         (ulong)(in_stack_ffffffffffffff4c + 0xff),
                                         in_stack_ffffffffffffff48,pcVar24);
                if (bVar16) {
                  in_stack_ffffffffffffff40 =
                       *(float *)((long)((ImVector<float> *)this->InputBuf + 1) + 4);
                  in_stack_ffffffffffffff3c = (local_10->ItemSpacing).y;
                  IVar7 = ImGui::GetCursorScreenPos();
                  fVar41 = IVar7.x;
                  in_stack_ffffffffffffff38 = IVar7.y;
                  local_d8 = ImGui::GetWindowDrawList();
                  for (local_dc = 0; local_dc < 0x100; local_dc = local_dc + 1) {
                    ImVec2::ImVec2(&local_e4,
                                   (float)(local_dc & 0xf) *
                                   (in_stack_ffffffffffffff40 + in_stack_ffffffffffffff3c) + fVar41,
                                   (float)(local_dc >> 4) *
                                   (in_stack_ffffffffffffff40 + in_stack_ffffffffffffff3c) +
                                   in_stack_ffffffffffffff38);
                    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff14,
                                   local_e4.x + in_stack_ffffffffffffff40,
                                   local_e4.y + in_stack_ffffffffffffff40);
                    pIVar22 = ImFont::FindGlyphNoFallback
                                        ((ImFont *)this,
                                         (short)in_stack_ffffffffffffff4c + (short)local_dc);
                    ImDrawList::AddRect(in_stack_ffffffffffffff10,(ImVec2 *)pIVar22,
                                        in_stack_ffffffffffffff00,(ImU32)in_stack_fffffffffffffefc,
                                        in_stack_fffffffffffffef8,
                                        (ImDrawCornerFlags)in_stack_fffffffffffffef4,
                                        in_stack_fffffffffffffef0);
                    if (pIVar22 != (ImFontGlyph *)0x0) {
                      in_stack_ffffffffffffff00 = (ImVec2 *)CONCAT44(local_e4.y,local_e4.x);
                      in_stack_fffffffffffffe70 = this;
                      in_stack_fffffffffffffe78 = local_d8;
                      fVar42 = in_stack_ffffffffffffff40;
                      ImGui::GetColorU32((ImGuiCol)in_stack_ffffffffffffff40,
                                         in_stack_fffffffffffffe80);
                      ImFont::RenderChar((ImFont *)in_stack_fffffffffffffec8,
                                         (ImDrawList *)in_stack_fffffffffffffec0,
                                         in_stack_fffffffffffffebc,in_stack_fffffffffffffed0,
                                         in_stack_fffffffffffffeb8,
                                         (ImWchar)((uint)in_stack_fffffffffffffeb4 >> 0x10));
                      in_stack_fffffffffffffe84 = in_stack_ffffffffffffff40;
                      in_stack_ffffffffffffff40 = fVar42;
                    }
                    if ((pIVar22 != (ImFontGlyph *)0x0) &&
                       (bVar16 = ImGui::IsMouseHoveringRect
                                           ((ImVec2 *)
                                            CONCAT44(in_stack_fffffffffffffeac,
                                                     in_stack_fffffffffffffea8),
                                            in_stack_fffffffffffffea0,
                                            SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0)),
                       bVar16)) {
                      ImGui::BeginTooltip();
                      ImGui::Text("Codepoint: U+%04X",(ulong)(in_stack_ffffffffffffff4c + local_dc))
                      ;
                      ImGui::Separator();
                      ImGui::Text("AdvanceX: %.1f");
                      ImGui::Text((char *)CONCAT17(extraout_XMM0_Bh_01,
                                                   CONCAT16(extraout_XMM0_Bg_01,
                                                            CONCAT15(extraout_XMM0_Bf_01,
                                                                     CONCAT14(extraout_XMM0_Be_01,
                                                                              CONCAT13(
                                                  extraout_XMM0_Bd_01,
                                                  CONCAT12(extraout_XMM0_Bc_01,
                                                           CONCAT11(extraout_XMM0_Bb_01,
                                                                    extraout_XMM0_Ba_01))))))),
                                  (double)pIVar22->Y0,(double)pIVar22->X1,(double)pIVar22->Y1,
                                  "Pos: (%.2f,%.2f)->(%.2f,%.2f)");
                      ImGui::Text((char *)CONCAT17(extraout_XMM0_Bh_02,
                                                   CONCAT16(extraout_XMM0_Bg_02,
                                                            CONCAT15(extraout_XMM0_Bf_02,
                                                                     CONCAT14(extraout_XMM0_Be_02,
                                                                              CONCAT13(
                                                  extraout_XMM0_Bd_02,
                                                  CONCAT12(extraout_XMM0_Bc_02,
                                                           CONCAT11(extraout_XMM0_Bb_02,
                                                                    extraout_XMM0_Ba_02))))))),
                                  (double)pIVar22->V0,(double)pIVar22->U1,(double)pIVar22->V1,
                                  "UV: (%.3f,%.3f)->(%.3f,%.3f)");
                      ImGui::EndTooltip();
                    }
                  }
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef8,
                                 (in_stack_ffffffffffffff40 + in_stack_ffffffffffffff3c) * 16.0,
                                 (in_stack_ffffffffffffff40 + in_stack_ffffffffffffff3c) * 16.0);
                  ImGui::Dummy((ImVec2 *)in_stack_fffffffffffffe90);
                  ImGui::TreePop();
                }
              }
            }
            ImGui::TreePop();
          }
          ImGui::TreePop();
        }
        ImGui::PopID();
        local_8c = local_8c + 1;
      }
      bVar16 = ImGui::TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",pIVar2->TexWidth,
                               pIVar2->TexHeight);
      if (bVar16) {
        ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffee8,1.0,1.0,1.0,1.0);
        ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffed8,1.0,1.0,1.0,0.5);
        flags = (ImGuiSliderFlags)((ulong)pIVar2->TexID >> 0x20);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffed0,(float)pIVar2->TexWidth,
                       (float)pIVar2->TexHeight);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec8,0.0,0.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec0,1.0,1.0);
        ImGui::Image((ImTextureID)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (ImVec2 *)in_stack_ffffffffffffff50,
                     (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (ImVec4 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (ImVec4 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        ImGui::TreePop();
      }
      HelpMarker((char *)0x10e950);
      bVar16 = ImGui::DragFloat(in_stack_fffffffffffffe90->InputBuf,
                                (float *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                                in_stack_fffffffffffffe80,fVar41,in_stack_fffffffffffffe70->InputBuf
                                ,flags);
      if (bVar16) {
        ImGui::SetWindowFontScale((float)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      }
      ImGui::DragFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                       in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,fVar41,
                       in_stack_fffffffffffffe70->InputBuf,flags);
      ImGui::PopItemWidth();
      ImGui::EndTabItem();
    }
    bVar16 = ImGui::BeginTabItem((char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98),
                                 (bool *)in_stack_fffffffffffffe90,
                                 (ImGuiTabItemFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    if (bVar16) {
      ImGui::Checkbox((char *)in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
      ImGui::SameLine((float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                      SUB84(in_stack_fffffffffffffe70,0));
      HelpMarker((char *)0x10ea2f);
      ImGui::Checkbox((char *)in_stack_ffffffffffffffb8,(bool *)in_stack_ffffffffffffffb0);
      ImGui::PushItemWidth(in_stack_fffffffffffffe84);
      ImGui::DragFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                       in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,fVar41,
                       in_stack_fffffffffffffe70->InputBuf,flags);
      if (local_10->CurveTessellationTol <= 0.1 && local_10->CurveTessellationTol != 0.1) {
        local_10->CurveTessellationTol = 0.1;
      }
      ImGui::DragFloat(in_stack_fffffffffffffe90->InputBuf,(float *)in_stack_fffffffffffffe88,
                       in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,fVar41,
                       in_stack_fffffffffffffe70->InputBuf,flags);
      ImGui::PopItemWidth();
      ImGui::EndTabItem();
    }
    ImGui::EndTabBar();
  }
  ImGui::PopItemWidth();
  return;
}

Assistant:

void ImTui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding"); ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine();
            ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine();
            ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf); ImGui::SameLine();
            HelpMarker("In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(ImGui::GetWindowWidth()*0.5f);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                    // Read the FAQ and docs/FONTS.txt about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.txt for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                bool font_details_opened = ImGui::TreeNode(font, "Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
                ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) { io.FontDefault = font; }
                if (font_details_opened)
                {
                    ImGui::PushFont(font);
                    ImGui::Text("The quick brown fox jumps over the lazy dog");
                    ImGui::PopFont();
                    ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                    ImGui::SameLine(); HelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                    ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                    ImGui::Text("Fallback character: '%c' (U+%04X)", font->FallbackChar, font->FallbackChar);
                    ImGui::Text("Ellipsis character: '%c' (U+%04X)", font->EllipsisChar, font->EllipsisChar);
                    const float surface_sqrt = sqrtf((float)font->MetricsTotalSurface);
                    ImGui::Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, (int)surface_sqrt, (int)surface_sqrt);
                    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                        if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                            ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                    if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                    {
                        // Display all glyphs of the fonts in separate pages of 256 characters
                        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
                        {
                            int count = 0;
                            for (unsigned int n = 0; n < 256; n++)
                                count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                            if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                            {
                                float cell_size = font->FontSize * 1;
                                float cell_spacing = style.ItemSpacing.y;
                                ImVec2 base_pos = ImGui::GetCursorScreenPos();
                                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                                for (unsigned int n = 0; n < 256; n++)
                                {
                                    ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                    ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                    const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                                    draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                                    if (glyph)
                                        font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base + n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                    if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                    {
                                        ImGui::BeginTooltip();
                                        ImGui::Text("Codepoint: U+%04X", base + n);
                                        ImGui::Separator();
                                        ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                        ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                        ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                        ImGui::EndTooltip();
                                    }
                                }
                                ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                                ImGui::TreePop();
                            }
                        }
                        ImGui::TreePop();
                    }
                    ImGui::TreePop();
                }
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            HelpMarker("Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.2f"))   // scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.2f");      // scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, "%.2f", ImGuiSliderFlags_Logarithmic);
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;
            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}